

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

int libssh2_agent_list_identities(LIBSSH2_AGENT *agent)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  list_node *entry;
  list_head *__dest;
  ulong uVar5;
  list_node *plVar6;
  char *errmsg;
  LIBSSH2_SESSION *pLVar7;
  ulong uVar8;
  uchar *puVar9;
  long lVar10;
  uchar local_49;
  ulong local_48;
  size_t local_40;
  list_head *local_38;
  
  *(undefined8 *)&(agent->transctx).state = 0;
  (agent->transctx).send_recv_total = 0;
  (agent->transctx).response = (uchar *)0x0;
  (agent->transctx).response_len = 0;
  (agent->transctx).request = (uchar *)0x0;
  (agent->transctx).request_len = 0;
  agent_free_identities(agent);
  local_49 = '\v';
  if ((agent->transctx).state == agent_NB_state_init) {
    (agent->transctx).request = &local_49;
    (agent->transctx).request_len = 1;
    (agent->transctx).send_recv_total = 0;
    (agent->transctx).state = agent_NB_state_request_created;
  }
  if (*(agent->transctx).request == '\v') {
    if (agent->ops != (agent_ops *)0x0) {
      iVar3 = (*agent->ops->transact)(agent,&agent->transctx);
      if (iVar3 != 0) {
        (*agent->session->free)((agent->transctx).response,&agent->session->abstract);
        (agent->transctx).response = (uchar *)0x0;
        return iVar3;
      }
      (agent->transctx).request = (uchar *)0x0;
      sVar1 = (agent->transctx).response_len;
      iVar3 = -0x2a;
      if (((0 < (long)sVar1) && (4 < (long)sVar1)) &&
         (puVar9 = (agent->transctx).response, *puVar9 == '\f')) {
        uVar8 = sVar1 - 5;
        uVar4 = _libssh2_ntohu32(puVar9 + 1);
        puVar9 = puVar9 + 5;
        local_38 = &agent->head;
        lVar10 = (ulong)uVar4 + 1;
        iVar3 = 0;
        do {
          lVar10 = lVar10 + -1;
          if (lVar10 == 0) break;
          uVar5 = uVar8 - 4;
          if ((long)uVar8 < 4) {
            bVar2 = false;
            uVar8 = uVar5;
            iVar3 = -0x2a;
          }
          else {
            entry = (list_node *)(*agent->session->alloc)(0x40,&agent->session->abstract);
            uVar8 = uVar5;
            if (entry == (list_node *)0x0) {
LAB_00107e1c:
              bVar2 = false;
              iVar3 = -6;
            }
            else {
              uVar4 = _libssh2_ntohu32(puVar9);
              plVar6 = (list_node *)(ulong)uVar4;
              entry[2].next = plVar6;
              puVar9 = puVar9 + 4;
              uVar8 = uVar5 - (long)plVar6;
              pLVar7 = agent->session;
              if ((long)uVar8 < 0) {
                (*pLVar7->free)(entry,&pLVar7->abstract);
              }
              else {
                __dest = (list_head *)(*pLVar7->alloc)((size_t)plVar6,&pLVar7->abstract);
                entry[1].head = __dest;
                if (__dest == (list_head *)0x0) {
LAB_00107e13:
                  (*agent->session->free)(entry,&agent->session->abstract);
                  goto LAB_00107e1c;
                }
                memcpy(__dest,puVar9,(size_t)entry[2].next);
                puVar9 = puVar9 + (long)entry[2].next;
                local_48 = uVar8 - 4;
                if (3 < (long)uVar8) {
                  uVar4 = _libssh2_ntohu32(puVar9);
                  uVar5 = (ulong)uVar4;
                  puVar9 = puVar9 + 4;
                  uVar8 = local_48 - uVar5;
                  if (uVar5 <= local_48) {
                    local_40 = uVar5;
                    plVar6 = (list_node *)
                             (*agent->session->alloc)(uVar5 + 1,&agent->session->abstract);
                    entry[2].prev = plVar6;
                    if (plVar6 != (list_node *)0x0) {
                      *(undefined1 *)((long)&plVar6->next + local_40) = 0;
                      memcpy(entry[2].prev,puVar9,local_40);
                      puVar9 = puVar9 + local_40;
                      _libssh2_list_add(local_38,entry);
                      bVar2 = true;
                      goto LAB_00107e23;
                    }
                    (*agent->session->free)(entry[1].head,&agent->session->abstract);
                    goto LAB_00107e13;
                  }
                }
                (*agent->session->free)(entry[1].head,&agent->session->abstract);
                (*agent->session->free)(entry,&agent->session->abstract);
                uVar8 = local_48;
              }
              bVar2 = false;
              iVar3 = -0x2a;
            }
          }
LAB_00107e23:
        } while (bVar2);
      }
      (*agent->session->free)((agent->transctx).response,&agent->session->abstract);
      (agent->transctx).response = (uchar *)0x0;
      pLVar7 = agent->session;
      errmsg = "agent list id failed";
      goto LAB_00107c8a;
    }
    pLVar7 = agent->session;
    errmsg = "agent not connected";
  }
  else {
    pLVar7 = agent->session;
    errmsg = "illegal agent request";
  }
  iVar3 = -0x27;
LAB_00107c8a:
  iVar3 = _libssh2_error(pLVar7,iVar3,errmsg);
  return iVar3;
}

Assistant:

static int
agent_list_identities(LIBSSH2_AGENT *agent)
{
    agent_transaction_ctx_t transctx = &agent->transctx;
    ssize_t len, num_identities;
    unsigned char *s;
    int rc;
    unsigned char c = SSH2_AGENTC_REQUEST_IDENTITIES;

    /* Create a request to list identities */
    if(transctx->state == agent_NB_state_init) {
        transctx->request = &c;
        transctx->request_len = 1;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_REQUEST_IDENTITIES)
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "illegal agent request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        LIBSSH2_FREE(agent->session, transctx->response);
        transctx->response = NULL;
        return rc;
    }
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_IDENTITIES_ANSWER) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Read the length of identities */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    num_identities = _libssh2_ntohu32(s);
    s += 4;

    while(num_identities--) {
        struct agent_publickey *identity;
        size_t comment_len;

        /* Read the length of the blob */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            goto error;
        }
        identity = LIBSSH2_ALLOC(agent->session, sizeof(*identity));
        if(!identity) {
            rc = LIBSSH2_ERROR_ALLOC;
            goto error;
        }
        identity->external.blob_len = _libssh2_ntohu32(s);
        s += 4;

        /* Read the blob */
        len -= identity->external.blob_len;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }

        identity->external.blob = LIBSSH2_ALLOC(agent->session,
                                                identity->external.blob_len);
        if(!identity->external.blob) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        memcpy(identity->external.blob, s, identity->external.blob_len);
        s += identity->external.blob_len;

        /* Read the length of the comment */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        comment_len = _libssh2_ntohu32(s);
        s += 4;

        if(comment_len > (size_t)len) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        /* Read the comment */
        len -= comment_len;

        identity->external.comment = LIBSSH2_ALLOC(agent->session,
                                                   comment_len + 1);
        if(!identity->external.comment) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        identity->external.comment[comment_len] = '\0';
        memcpy(identity->external.comment, s, comment_len);
        s += comment_len;

        _libssh2_list_add(&agent->head, &identity->node);
    }
error:
    LIBSSH2_FREE(agent->session, transctx->response);
    transctx->response = NULL;

    return _libssh2_error(agent->session, rc,
                          "agent list id failed");
}